

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void middle_finish_loading(middle_t *middle,uint32 next_end)

{
  bitarr_address_t address_00;
  bitarr_address_t address;
  uint32 next_end_local;
  middle_t *middle_local;
  
  address_00.offset =
       ((middle->base).insert_index + 1) * (uint)(middle->base).total_bits -
       (uint)(middle->next_mask).bits;
  address_00.base = (middle->base).base;
  address_00._12_4_ = 0;
  bitarr_write_int25(address_00,(middle->next_mask).bits,next_end);
  return;
}

Assistant:

static void
middle_finish_loading(middle_t * middle, uint32 next_end)
{
    bitarr_address_t address;
    address.base = middle->base.base;
    address.offset =
        (middle->base.insert_index + 1) * middle->base.total_bits -
        middle->next_mask.bits;
    bitarr_write_int25(address, middle->next_mask.bits, next_end);
}